

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
::emplace_at<int>(raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                  *this,iterator iter,int *args)

{
  bool bVar1;
  reference key;
  iterator local_40;
  iterator local_30;
  iterator local_20;
  
  local_20.field_1 = iter.field_1;
  local_20.ctrl_ = iter.ctrl_;
  *local_20.field_1.slot_ = *args;
  key = iterator::operator*(&local_20);
  local_30 = find<int>(this,key);
  local_40.ctrl_ = local_20.ctrl_;
  local_40.field_1.slot_ = local_20.field_1.slot_;
  bVar1 = container_internal::operator==(&local_30,&local_40);
  if (bVar1) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xf3f,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>, Args = <int>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }